

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Builder * __thiscall
capnp::DynamicList::Builder::operator[](Builder *__return_storage_ptr__,Builder *this,uint index)

{
  double dVar1;
  byte bVar2;
  undefined2 uVar3;
  ElementSize elementSize;
  Which WVar4;
  uint uVar5;
  StructSchema SVar6;
  ulong uVar7;
  EnumSchema EVar8;
  InterfaceSchema IVar9;
  uint uVar10;
  Type TVar11;
  ArrayPtr<unsigned_char> AVar12;
  Fault f;
  ListSchema elementType;
  Reader local_128;
  Type local_f8;
  PointerBuilder local_e8;
  Schema local_c8;
  Builder local_c0;
  StructBuilder local_a8;
  ListBuilder local_80;
  ListBuilder local_58;
  
  if ((this->builder).elementCount <= index) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)&local_128,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x448,FAILED,"index < size()","\"List index out-of-bounds.\"",
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal((Fault *)&local_128);
  }
  WVar4 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar4 = (this->schema).elementType.baseType;
  }
  switch(WVar4) {
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar2 = (this->builder).ptr[index >> 3];
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bVar2 >> (index & 7) & 1) != 0;
    break;
  case INT8:
    uVar7 = (ulong)(char)(this->builder).ptr[(ulong)(this->builder).step * (ulong)index >> 3];
    goto LAB_00291601;
  case INT16:
    uVar7 = (ulong)*(short *)((this->builder).ptr +
                             ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_00291601;
  case INT32:
    uVar7 = (ulong)*(int *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3))
    ;
    goto LAB_00291601;
  case INT64:
    uVar7 = *(ulong *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_00291601:
    __return_storage_ptr__->type = INT;
LAB_0029169f:
    (__return_storage_ptr__->field_1).intValue = uVar7;
    break;
  case UINT8:
    uVar7 = (ulong)(this->builder).ptr[(ulong)(this->builder).step * (ulong)index >> 3];
    goto LAB_00291699;
  case UINT16:
    uVar7 = (ulong)*(ushort *)
                    ((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_00291699;
  case UINT32:
    uVar7 = (ulong)*(uint *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)
                            );
    goto LAB_00291699;
  case UINT64:
    uVar7 = *(ulong *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_00291699:
    __return_storage_ptr__->type = UINT;
    goto LAB_0029169f;
  case FLOAT32:
    dVar1 = (double)*(float *)((this->builder).ptr +
                              ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_00291677;
  case FLOAT64:
    dVar1 = *(double *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_00291677:
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)dVar1;
    break;
  case TEXT:
    local_128._reader.data = (this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)
    ;
    local_128._reader.segment = &((this->builder).segment)->super_SegmentReader;
    local_128._reader.capTable = &((this->builder).capTable)->super_CapTableReader;
    _::PointerBuilder::getBlob<capnp::Text>(&local_c0,(PointerBuilder *)&local_128,(void *)0x0,0);
    (__return_storage_ptr__->field_1).textValue.content.size_ = local_c0.content.size_;
    (__return_storage_ptr__->field_1).intValue = local_c0._0_8_;
    (__return_storage_ptr__->field_1).textValue.content.ptr = local_c0.content.ptr;
    __return_storage_ptr__->type = TEXT;
    break;
  case DATA:
    local_128._reader.data = (this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)
    ;
    local_128._reader.segment = &((this->builder).segment)->super_SegmentReader;
    local_128._reader.capTable = &((this->builder).capTable)->super_CapTableReader;
    AVar12 = (ArrayPtr<unsigned_char>)
             _::PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&local_128,(void *)0x0,0);
    __return_storage_ptr__->type = DATA;
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<unsigned_char> = AVar12;
    break;
  case LIST:
    TVar11 = (Type)Type::asList((Type *)this);
    local_f8 = TVar11;
    if (TVar11.baseType == STRUCT &&
        ((undefined1  [16])TVar11 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      local_e8.pointer =
           (WirePointer *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
      local_e8.segment = (this->builder).segment;
      local_e8.capTable = (this->builder).capTable;
      local_c8.raw = (RawBrandedSchema *)Type::asStruct(&local_f8);
      Schema::getProto(&local_128,&local_c8);
      uVar5 = 0;
      if (local_128._reader.dataSize < 0x80) {
        uVar10 = 0;
      }
      else {
        uVar10 = (uint)(((WirePointer *)((long)local_128._reader.data + 8))->field_1).structRef.
                       ptrCount.value;
        if (0xcf < local_128._reader.dataSize) {
          uVar5 = (uint)(ushort)(((WirePointer *)((long)local_128._reader.data + 0x18))->
                                offsetAndKind).value << 0x10;
        }
      }
      _::PointerBuilder::getStructList(&local_58,&local_e8,(StructSize)(uVar10 | uVar5),(word *)0x0)
      ;
      *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) =
           local_58.structDataSize;
      *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) =
           local_58.structPointerCount;
      *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_58.elementSize;
      *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_58._39_1_;
    }
    else {
      local_128._reader.data =
           (this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3);
      local_128._reader.segment = &((this->builder).segment)->super_SegmentReader;
      local_128._reader.capTable = &((this->builder).capTable)->super_CapTableReader;
      WVar4 = LIST;
      if (((undefined1  [16])TVar11 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
        WVar4 = TVar11.baseType;
      }
      elementSize = anon_unknown_71::elementSizeFor(WVar4);
      _::PointerBuilder::getList(&local_80,(PointerBuilder *)&local_128,elementSize,(word *)0x0);
      *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) =
           local_80.structDataSize;
      *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) =
           local_80.structPointerCount;
      *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_80.elementSize;
      *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_80._39_1_;
      local_58.segment._0_4_ = local_80.segment._0_4_;
      local_58.segment._4_4_ = local_80.segment._4_4_;
      local_58.capTable._0_4_ = local_80.capTable._0_4_;
      local_58.capTable._4_4_ = local_80.capTable._4_4_;
      local_58.ptr._0_4_ = local_80.ptr._0_4_;
      local_58.ptr._4_4_ = local_80.ptr._4_4_;
      local_58.elementCount = local_80.elementCount;
      local_58.step = local_80.step;
    }
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_58.ptr._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x24) = local_58.ptr._4_4_;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_58.elementCount;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = local_58.step;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_58.segment._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x14) = local_58.segment._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x18) = local_58.capTable._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x1c) = local_58.capTable._4_4_;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).listValue.schema.elementType = TVar11;
    break;
  case ENUM:
    EVar8 = Type::asEnum((Type *)this);
    uVar3 = *(undefined2 *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3))
    ;
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)EVar8.super_Schema.raw;
    *(undefined2 *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar3;
    break;
  case STRUCT:
    SVar6 = Type::asStruct((Type *)this);
    _::ListBuilder::getStructElement(&local_a8,&this->builder,index);
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.builder.elementCount =
         local_a8._32_8_;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = (CapTableBuilder *)local_a8.data;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = (byte *)local_a8.pointers;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_a8.segment;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)local_a8.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).structValue.schema.super_Schema.raw =
         (RawBrandedSchema *)SVar6.super_Schema.raw;
    break;
  case INTERFACE:
    IVar9 = Type::asInterface((Type *)this);
    local_128._reader.data = (this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)
    ;
    local_128._reader.segment = &((this->builder).segment)->super_SegmentReader;
    local_128._reader.capTable = &((this->builder).capTable)->super_CapTableReader;
    _::PointerBuilder::getCapability(&local_e8);
    __return_storage_ptr__->type = CAPABILITY;
    (__return_storage_ptr__->field_1).intValue = (int64_t)local_e8.segment;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_e8.capTable;
    (__return_storage_ptr__->field_1).capabilityValue.schema.super_Schema.raw =
         (RawBrandedSchema *)IVar9.super_Schema.raw;
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)&local_128,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x47b,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal((Fault *)&local_128);
  default:
    __return_storage_ptr__->type = UNKNOWN;
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::operator[](uint index) {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return builder.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getStructList(structSizeFromSchema(elementType.getStructElementType()),
                                  nullptr));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getList(elementSizeFor(elementType.whichElementType()), nullptr));
      }
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Builder(schema.getStructElementType(),
                                    builder.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         builder.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       builder.getPointerElement(bounded(index) * ELEMENTS)
                                              .getCapability());
  }

  return nullptr;
}